

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::InvocationInterlockPlacementPass::Process(InvocationInterlockPlacementPass *this)

{
  _func_int **pp_Var1;
  Instruction *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  const_iterator cVar5;
  Function *pFVar6;
  Status SVar7;
  pointer puVar8;
  uint uVar9;
  byte bVar10;
  Module *pMVar11;
  Instruction *entry_inst;
  Instruction *pIVar12;
  Module *pMVar13;
  Function *func;
  unordered_set<spvtools::opt::Function_*,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<spvtools::opt::Function_*>_>
  entry_points;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_78;
  Function *local_70;
  undefined1 local_68 [40];
  _func_int **local_40;
  Instruction *pIStack_38;
  
  bVar3 = isFragmentShaderInterlockEnabled(this);
  SVar7 = SuccessWithoutChange;
  if (bVar3) {
    local_68._0_8_ = &pIStack_38;
    local_68._8_8_ = (pointer)0x1;
    local_68._16_8_ = (_Hash_node_base *)0x0;
    local_68._24_8_ = (pointer)0x0;
    local_68._32_4_ = 1.0;
    local_40 = (_func_int **)0x0;
    pIStack_38 = (Instruction *)0x0;
    pMVar13 = (((this->super_Pass).context_)->module_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
              .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    pIVar2 = (Instruction *)
             ((long)&(pMVar13->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
    pIVar12 = *(Instruction **)
               ((long)&(pMVar13->entry_points_).super_IntrusiveList<spvtools::opt::Instruction> +
               0x10);
    if (pIVar12 != pIVar2) {
      do {
        uVar9 = (pIVar12->has_result_id_ & 1) + 1;
        if (pIVar12->has_type_id_ == false) {
          uVar9 = (uint)pIVar12->has_result_id_;
        }
        uVar4 = Instruction::GetSingleWordOperand(pIVar12,uVar9 + 1);
        local_70 = IRContext::GetFunction((this->super_Pass).context_,uVar4);
        local_78._M_head_impl = (Function *)local_68;
        std::
        _Hashtable<spvtools::opt::Function*,spvtools::opt::Function*,std::allocator<spvtools::opt::Function*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Function*>,std::hash<spvtools::opt::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Function*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Function*,false>>>>
                  ((_Hashtable<spvtools::opt::Function*,spvtools::opt::Function*,std::allocator<spvtools::opt::Function*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Function*>,std::hash<spvtools::opt::Function*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_68,&local_70,&local_78);
        pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      } while (pIVar12 != pIVar2);
      pMVar13 = (((this->super_Pass).context_)->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
    }
    puVar8 = (pMVar13->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar8 == *(pointer *)
                   ((long)&(pMVar13->functions_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                           ._M_impl + 8)) {
      bVar10 = 0;
      pMVar11 = pMVar13;
    }
    else {
      bVar10 = 0;
      do {
        local_78._M_head_impl =
             (puVar8->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
        recordBeginOrEndInFunction(this,local_78._M_head_impl);
        pIVar12 = (Instruction *)
                  (&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_68._0_8_)->
                    _vptr_IntrusiveNodeBase)[(ulong)local_78._M_head_impl % (ulong)local_68._8_8_];
        if (pIVar12 != (Instruction *)0x0) {
          pp_Var1 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                    _vptr_IntrusiveNodeBase;
          pFVar6 = (Function *)pp_Var1[1];
          do {
            if (local_78._M_head_impl == pFVar6) goto LAB_00230922;
            pp_Var1 = (_func_int **)*pp_Var1;
          } while ((pp_Var1 != (_func_int **)0x0) &&
                  (pFVar6 = (Function *)pp_Var1[1],
                  (ulong)pFVar6 % (ulong)local_68._8_8_ ==
                  (ulong)local_78._M_head_impl % (ulong)local_68._8_8_));
        }
        cVar5 = std::
                _Hashtable<spvtools::opt::Function_*,_std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->extracted_functions_)._M_h,&local_78._M_head_impl);
        if (cVar5.
            super__Node_iterator_base<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>,_false>
            ._M_cur != (__node_type *)0x0) {
          bVar3 = removeBeginAndEndInstructionsFromFunction(this,local_78._M_head_impl);
          bVar10 = bVar10 | bVar3;
        }
LAB_00230922:
        puVar8 = puVar8 + 1;
        pMVar11 = (((this->super_Pass).context_)->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      } while ((pMVar13 != pMVar11) ||
              (puVar8 != *(pointer *)
                          ((long)&(pMVar11->functions_).
                                  super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                          + 8)));
    }
    for (pIVar12 = (pMVar11->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.
                   sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        pIVar12 !=
        &(pMVar11->entry_points_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
        pIVar12 = (pIVar12->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
      uVar9 = (pIVar12->has_result_id_ & 1) + 1;
      if (pIVar12->has_type_id_ == false) {
        uVar9 = (uint)pIVar12->has_result_id_;
      }
      uVar4 = Instruction::GetSingleWordOperand(pIVar12,uVar9 + 1);
      pFVar6 = IRContext::GetFunction((this->super_Pass).context_,uVar4);
      uVar4 = (pIVar12->has_result_id_ & 1) + 1;
      if (pIVar12->has_type_id_ == false) {
        uVar4 = (uint)pIVar12->has_result_id_;
      }
      uVar4 = Instruction::GetSingleWordOperand(pIVar12,uVar4);
      if (uVar4 == 4) {
        bVar3 = processFragmentShaderEntry(this,pFVar6);
        bVar10 = bVar10 | bVar3;
      }
    }
    SVar7 = bVar10 ^ SuccessWithoutChange;
    std::
    _Hashtable<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<spvtools::opt::Function_*,_spvtools::opt::Function_*,_std::allocator<spvtools::opt::Function_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Function_*>,_std::hash<spvtools::opt::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)local_68);
  }
  return SVar7;
}

Assistant:

Pass::Status InvocationInterlockPlacementPass::Process() {
  // Skip this pass if the necessary extension or capability is missing
  if (!isFragmentShaderInterlockEnabled()) {
    return Status::SuccessWithoutChange;
  }

  bool modified = false;

  std::unordered_set<Function*> entry_points;
  for (Instruction& entry_inst : context()->module()->entry_points()) {
    uint32_t entry_id =
        entry_inst.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    entry_points.insert(context()->GetFunction(entry_id));
  }

  for (auto fi = context()->module()->begin(); fi != context()->module()->end();
       ++fi) {
    Function* func = &*fi;
    recordBeginOrEndInFunction(func);
    if (!entry_points.count(func) && extracted_functions_.count(func)) {
      modified |= removeBeginAndEndInstructionsFromFunction(func);
    }
  }

  for (Instruction& entry_inst : context()->module()->entry_points()) {
    uint32_t entry_id =
        entry_inst.GetSingleWordInOperand(kEntryPointFunctionIdInIdx);
    Function* entry_func = context()->GetFunction(entry_id);

    auto execution_model = spv::ExecutionModel(
        entry_inst.GetSingleWordInOperand(kEntryPointExecutionModelInIdx));

    if (execution_model != spv::ExecutionModel::Fragment) {
      continue;
    }

    modified |= processFragmentShaderEntry(entry_func);
  }

  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}